

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.h
# Opt level: O3

bool __thiscall
embree::sse2::PatchEvalGrid::eval
          (PatchEvalGrid *this,ulong param_2,ulong param_3,undefined8 param_4,undefined8 param_5)

{
  bool bVar1;
  
  if (param_2 == 0) {
    return false;
  }
  if (((uint)param_2 & 0xf) == 7) {
    bVar1 = eval(this,*(undefined8 *)
                       ((param_2 & 0xfffffffffffffff0) + 8 + (param_3 & 0xffffffff) * 8),param_4,
                 param_5,1);
    return bVar1;
  }
  bVar1 = eval(this,param_2,param_4,param_5,0);
  return bVar1;
}

Assistant:

__forceinline operator bool() const { return ptr != 0; }